

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void Assimp::Write(JSONWriter *out,aiCamera *ai,bool is_elem)

{
  aiCamera *paVar1;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  undefined1 local_19;
  aiCamera *paStack_18;
  bool is_elem_local;
  aiCamera *ai_local;
  JSONWriter *out_local;
  
  local_19 = is_elem;
  paStack_18 = ai;
  ai_local = (aiCamera *)out;
  JSONWriter::StartObj(out,is_elem);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"name",&local_41);
  JSONWriter::Key((JSONWriter *)paVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  JSONWriter::SimpleValue<aiString>((JSONWriter *)ai_local,&paStack_18->mName);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"aspect",&local_79);
  JSONWriter::Key((JSONWriter *)paVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  JSONWriter::SimpleValue<float>((JSONWriter *)ai_local,&paStack_18->mAspect);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"clipplanefar",&local_a1);
  JSONWriter::Key((JSONWriter *)paVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  JSONWriter::SimpleValue<float>((JSONWriter *)ai_local,&paStack_18->mClipPlaneFar);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"clipplanenear",&local_c9);
  JSONWriter::Key((JSONWriter *)paVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  JSONWriter::SimpleValue<float>((JSONWriter *)ai_local,&paStack_18->mClipPlaneNear);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"horizontalfov",&local_f1);
  JSONWriter::Key((JSONWriter *)paVar1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  JSONWriter::SimpleValue<float>((JSONWriter *)ai_local,&paStack_18->mHorizontalFOV);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"up",&local_119);
  JSONWriter::Key((JSONWriter *)paVar1,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  Write((JSONWriter *)ai_local,&paStack_18->mUp,false);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"lookat",&local_141);
  JSONWriter::Key((JSONWriter *)paVar1,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  Write((JSONWriter *)ai_local,&paStack_18->mLookAt,false);
  JSONWriter::EndObj((JSONWriter *)ai_local);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiCamera& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mName);

    out.Key("aspect");
    out.SimpleValue(ai.mAspect);

    out.Key("clipplanefar");
    out.SimpleValue(ai.mClipPlaneFar);

    out.Key("clipplanenear");
    out.SimpleValue(ai.mClipPlaneNear);

    out.Key("horizontalfov");
    out.SimpleValue(ai.mHorizontalFOV);

    out.Key("up");
    Write(out, ai.mUp, false);

    out.Key("lookat");
    Write(out, ai.mLookAt, false);

    out.EndObj();
}